

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall crnlib::mipmapped_texture::swap(mipmapped_texture *this,mipmapped_texture *img)

{
  uint uVar1;
  pixel_format pVar2;
  format fVar3;
  component_flags cVar4;
  component_flags cVar5;
  
  uVar1 = this->m_width;
  this->m_width = img->m_width;
  img->m_width = uVar1;
  cVar4 = img->m_comp_flags;
  uVar1 = this->m_height;
  cVar5 = this->m_comp_flags;
  this->m_height = img->m_height;
  this->m_comp_flags = cVar4;
  img->m_height = uVar1;
  img->m_comp_flags = cVar5;
  pVar2 = this->m_format;
  this->m_format = img->m_format;
  img->m_format = pVar2;
  vector<crnlib::vector<crnlib::mip_level_*>_>::swap(&this->m_faces,&img->m_faces);
  dynamic_string::swap(&this->m_last_error,&img->m_last_error);
  fVar3 = this->m_source_file_type;
  this->m_source_file_type = img->m_source_file_type;
  img->m_source_file_type = fVar3;
  return;
}

Assistant:

void mipmapped_texture::swap(mipmapped_texture& img) {
    std::swap(m_width, img.m_width);
    std::swap(m_height, img.m_height);
    std::swap(m_comp_flags, img.m_comp_flags);
    std::swap(m_format, img.m_format);
  m_faces.swap(img.m_faces);
  m_last_error.swap(img.m_last_error);
  std::swap(m_source_file_type, img.m_source_file_type);

  CRNLIB_ASSERT(check());
}